

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.cpp
# Opt level: O3

sample_t * Timidity::resample_voice(Renderer *song,Voice *vp,int *countptr)

{
  float fVar1;
  float fVar2;
  ushort uVar3;
  Sample *pSVar4;
  sample_t *psVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  sample_t *psVar9;
  byte bVar10;
  int iVar11;
  sample_t *psVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  bool bVar20;
  int le;
  
  pSVar4 = vp->sample;
  if (pSVar4->sample_rate == 0) {
    iVar11 = vp->sample_offset >> 0xc;
    iVar6 = (pSVar4->data_length >> 0xc) - iVar11;
    if (*countptr < iVar6) {
      vp->sample_offset = *countptr * 0x1000 + vp->sample_offset;
    }
    else {
      vp->status = '\0';
      *countptr = iVar6;
    }
    psVar9 = pSVar4->data + iVar11;
  }
  else {
    uVar3 = pSVar4->modes;
    bVar10 = vp->status;
    if (((bVar10 & 0x10) != 0) && (pSVar4->loop_end - pSVar4->loop_start < 2)) {
      bVar10 = bVar10 & 0xef;
      vp->status = bVar10;
    }
    if (vp->vibrato_control_ratio == 0) {
      if ((bVar10 & 0x10) == 0) {
        psVar9 = song->resample_buffer;
        psVar5 = pSVar4->data;
        uVar14 = vp->sample_offset;
        iVar11 = vp->sample_increment;
        uVar7 = pSVar4->data_length;
        iVar6 = -iVar11;
        if (0 < iVar11) {
          iVar6 = iVar11;
        }
        iVar11 = *countptr;
        iVar13 = (int)(uVar7 - uVar14) / iVar6;
        iVar18 = iVar13 + 1;
        iVar8 = iVar13 - iVar11;
        psVar12 = psVar9;
        if (iVar11 <= iVar13) {
          iVar18 = iVar11;
          iVar8 = -1;
        }
        for (; iVar18 != 0; iVar18 = iVar18 + -1) {
          iVar13 = (int)uVar14 >> 0xc;
          uVar16 = uVar14 & 0xfff;
          uVar14 = uVar14 + iVar6;
          *psVar12 = (float)uVar16 * 0.00024414062 * (psVar5[(long)iVar13 + 1] - psVar5[iVar13]) +
                     psVar5[iVar13];
          psVar12 = psVar12 + 1;
        }
        if ((int)uVar7 <= (int)uVar14) {
          if (uVar14 == uVar7) {
            *psVar12 = psVar5[(int)uVar7 >> 0xc];
          }
          vp->status = '\0';
          *countptr = iVar8 + iVar11;
        }
        vp->sample_offset = uVar14;
      }
      else {
        psVar9 = song->resample_buffer;
        iVar11 = *countptr;
        uVar14 = vp->sample_offset;
        iVar6 = vp->sample_increment;
        iVar13 = pSVar4->loop_start;
        iVar8 = pSVar4->loop_end;
        if ((uVar3 & 8) == 0) {
          if (iVar11 != 0) {
            psVar5 = pSVar4->data;
            psVar12 = psVar9;
            do {
              iVar18 = iVar13 - iVar8;
              if ((int)uVar14 < iVar8) {
                iVar18 = 0;
              }
              uVar14 = iVar18 + uVar14;
              iVar18 = (int)(iVar8 - uVar14) / iVar6;
              iVar17 = iVar18 + 1;
              if (iVar11 <= iVar18) {
                iVar17 = iVar11;
              }
              for (; iVar17 != 0; iVar17 = iVar17 + -1) {
                iVar19 = (int)uVar14 >> 0xc;
                uVar7 = uVar14 & 0xfff;
                uVar14 = uVar14 + iVar6;
                fVar1 = psVar5[iVar19];
                *psVar12 = (float)uVar7 * 0.00024414062 * (psVar5[(long)iVar19 + 1] - fVar1) + fVar1
                ;
                psVar12 = psVar12 + 1;
              }
            } while ((iVar18 < iVar11) && (iVar11 = iVar11 - (iVar18 + 1), iVar11 != 0));
          }
          vp->sample_offset = uVar14;
        }
        else {
          psVar5 = pSVar4->data;
          psVar12 = psVar9;
          if ((int)uVar14 <= iVar13) {
            iVar18 = (int)(iVar13 - uVar14) / iVar6;
            iVar19 = iVar11 - (iVar18 + 1);
            iVar17 = iVar11;
            if (iVar18 < iVar11) {
              iVar17 = iVar18 + 1;
            }
            bVar20 = iVar18 < iVar11;
            iVar11 = 0;
            if (bVar20) {
              iVar11 = iVar19;
            }
            for (; iVar17 != 0; iVar17 = iVar17 + -1) {
              *psVar12 = (float)(uVar14 & 0xfff) * 0.00024414062 *
                         (psVar5[(long)((int)uVar14 >> 0xc) + 1] - psVar5[(int)uVar14 >> 0xc]) +
                         psVar5[(int)uVar14 >> 0xc];
              uVar14 = uVar14 + iVar6;
              psVar12 = psVar12 + 1;
            }
          }
          for (; iVar11 != 0; iVar11 = iVar11 - (iVar18 + 1)) {
            iVar18 = iVar13;
            if (0 < iVar6) {
              iVar18 = iVar8;
            }
            iVar18 = (int)(iVar18 - uVar14) / iVar6;
            iVar17 = iVar18 + 1;
            if (iVar11 <= iVar18) {
              iVar17 = iVar11;
            }
            for (; iVar17 != 0; iVar17 = iVar17 + -1) {
              iVar19 = (int)uVar14 >> 0xc;
              uVar7 = uVar14 & 0xfff;
              uVar14 = uVar14 + iVar6;
              *psVar12 = (float)uVar7 * 0.00024414062 * (psVar5[(long)iVar19 + 1] - psVar5[iVar19])
                         + psVar5[iVar19];
              psVar12 = psVar12 + 1;
            }
            iVar17 = iVar8;
            if ((iVar8 <= (int)uVar14) || (iVar17 = iVar13, (int)uVar14 <= iVar13)) {
              uVar14 = iVar17 * 2 - uVar14;
              iVar6 = -iVar6;
            }
            if (iVar11 <= iVar18) break;
          }
          vp->sample_increment = iVar6;
          vp->sample_offset = uVar14;
        }
      }
    }
    else if ((bVar10 & 0x10) == 0) {
      psVar9 = song->resample_buffer;
      fVar1 = song->rate;
      psVar5 = pSVar4->data;
      uVar14 = pSVar4->data_length;
      iVar11 = vp->sample_increment;
      iVar6 = -iVar11;
      if (0 < iVar11) {
        iVar6 = iVar11;
      }
      iVar11 = vp->vibrato_control_counter;
      iVar13 = *countptr + 1;
      psVar12 = psVar9;
      uVar7 = vp->sample_offset;
      do {
        if (iVar13 == 1) goto LAB_00357049;
        bVar20 = iVar11 == 0;
        iVar11 = iVar11 + -1;
        if (bVar20) {
          iVar11 = vp->vibrato_control_ratio;
          iVar6 = update_vibrato(fVar1,vp,0);
        }
        uVar16 = iVar6 + uVar7;
        *psVar12 = (float)(uVar7 & 0xfff) * 0.00024414062 *
                   (psVar5[(long)((int)uVar7 >> 0xc) + 1] - psVar5[(int)uVar7 >> 0xc]) +
                   psVar5[(int)uVar7 >> 0xc];
        psVar12 = psVar12 + 1;
        iVar13 = iVar13 + -1;
        uVar7 = uVar16;
      } while ((int)uVar16 < (int)uVar14);
      if (uVar16 == uVar14) {
        *psVar12 = psVar5[(int)uVar14 >> 0xc];
      }
      vp->status = '\0';
      *countptr = *countptr - iVar13;
LAB_00357049:
      vp->vibrato_control_counter = iVar11;
      vp->sample_increment = iVar6;
      vp->sample_offset = uVar7;
    }
    else {
      psVar9 = song->resample_buffer;
      fVar1 = song->rate;
      iVar11 = *countptr;
      uVar14 = vp->sample_offset;
      uVar7 = vp->sample_increment;
      iVar6 = pSVar4->loop_start;
      iVar13 = pSVar4->loop_end;
      if ((uVar3 & 8) == 0) {
        iVar8 = vp->vibrato_control_counter;
        if (iVar11 != 0) {
          psVar5 = pSVar4->data;
          psVar12 = psVar9;
          do {
            iVar18 = iVar6 - iVar13;
            if ((int)uVar14 < iVar13) {
              iVar18 = 0;
            }
            uVar14 = iVar18 + uVar14;
            iVar18 = (int)(iVar13 - uVar14) / (int)uVar7;
            iVar17 = iVar18 + 1;
            if (iVar11 <= iVar18) {
              iVar17 = iVar11;
            }
            iVar18 = iVar8;
            iVar19 = iVar8;
            if (iVar17 < iVar8) {
              iVar18 = iVar17;
              iVar19 = iVar17;
            }
            for (; iVar18 != 0; iVar18 = iVar18 + -1) {
              iVar15 = (int)uVar14 >> 0xc;
              uVar16 = uVar14 & 0xfff;
              uVar14 = uVar14 + uVar7;
              fVar2 = psVar5[iVar15];
              *psVar12 = (float)uVar16 * 0.00024414062 * (psVar5[(long)iVar15 + 1] - fVar2) + fVar2;
              psVar12 = psVar12 + 1;
            }
            if (iVar8 < iVar17) {
              iVar8 = vp->vibrato_control_ratio;
              uVar7 = update_vibrato(fVar1,vp,0);
            }
            else {
              iVar8 = -(iVar17 - iVar8);
            }
            iVar11 = iVar11 - iVar19;
          } while (iVar11 != 0);
        }
        vp->vibrato_control_counter = iVar8;
      }
      else {
        psVar5 = pSVar4->data;
        iVar8 = vp->vibrato_control_counter;
        psVar12 = psVar9;
        if ((int)uVar14 <= iVar6 && iVar11 != 0) {
          do {
            iVar18 = (int)(iVar6 - uVar14) / (int)uVar7;
            iVar17 = iVar18 + 1;
            if (iVar11 <= iVar18) {
              iVar17 = iVar11;
            }
            iVar18 = iVar8;
            iVar19 = iVar8;
            if (iVar17 < iVar8) {
              iVar18 = iVar17;
              iVar19 = iVar17;
            }
            for (; iVar18 != 0; iVar18 = iVar18 + -1) {
              iVar15 = (int)uVar14 >> 0xc;
              uVar16 = uVar14 & 0xfff;
              uVar14 = uVar14 + uVar7;
              *psVar12 = (float)uVar16 * 0.00024414062 * (psVar5[(long)iVar15 + 1] - psVar5[iVar15])
                         + psVar5[iVar15];
              psVar12 = psVar12 + 1;
            }
            if (iVar8 < iVar17) {
              iVar8 = vp->vibrato_control_ratio;
              uVar7 = update_vibrato(fVar1,vp,0);
            }
            else {
              iVar8 = -(iVar17 - iVar8);
            }
            iVar11 = iVar11 - iVar19;
          } while ((iVar11 != 0) && ((int)uVar14 <= iVar6));
        }
        for (; iVar11 != 0; iVar11 = iVar11 - iVar19) {
          iVar18 = iVar6;
          if (0 < (int)uVar7) {
            iVar18 = iVar13;
          }
          iVar18 = (int)(iVar18 - uVar14) / (int)uVar7;
          iVar17 = iVar18 + 1;
          if (iVar11 <= iVar18) {
            iVar17 = iVar11;
          }
          iVar18 = iVar8;
          iVar19 = iVar8;
          if (iVar17 < iVar8) {
            iVar18 = iVar17;
            iVar19 = iVar17;
          }
          for (; iVar18 != 0; iVar18 = iVar18 + -1) {
            iVar15 = (int)uVar14 >> 0xc;
            uVar16 = uVar14 & 0xfff;
            uVar14 = uVar14 + uVar7;
            *psVar12 = (float)uVar16 * 0.00024414062 * (psVar5[(long)iVar15 + 1] - psVar5[iVar15]) +
                       psVar5[iVar15];
            psVar12 = psVar12 + 1;
          }
          if (iVar8 < iVar17) {
            iVar8 = vp->vibrato_control_ratio;
            uVar7 = update_vibrato(fVar1,vp,uVar7 >> 0x1f);
          }
          else {
            iVar8 = -(iVar17 - iVar8);
          }
          iVar18 = iVar13;
          if ((iVar13 <= (int)uVar14) || (iVar18 = iVar6, (int)uVar14 <= iVar6)) {
            uVar14 = iVar18 * 2 - uVar14;
            uVar7 = -uVar7;
          }
        }
        vp->vibrato_control_counter = iVar8;
      }
      vp->sample_increment = uVar7;
      vp->sample_offset = uVar14;
    }
  }
  return psVar9;
}

Assistant:

sample_t *resample_voice(Renderer *song, Voice *vp, int *countptr)
{
	int ofs;
	WORD modes;

	if (vp->sample->sample_rate == 0)
	{
		/* Pre-resampled data -- just update the offset and check if
		we're out of data. */
		ofs = vp->sample_offset >> FRACTION_BITS; /* Kind of silly to use FRACTION_BITS here... */
		if (*countptr >= (vp->sample->data_length >> FRACTION_BITS) - ofs)
		{
			/* Note finished. Free the voice. */
			vp->status = 0;

			/* Let the caller know how much data we had left */
			*countptr = (vp->sample->data_length >> FRACTION_BITS) - ofs;
		}
		else
		{
			vp->sample_offset += *countptr << FRACTION_BITS;
		}
		return vp->sample->data + ofs;
	}

	/* Need to resample. Use the proper function. */
	modes = vp->sample->modes;

	if (vp->status & VOICE_LPE)
	{
		if (vp->sample->loop_end - vp->sample->loop_start < 2)
		{ // Loop is too short; turn it off.
			vp->status &= ~VOICE_LPE;
		}
	}

	if (vp->vibrato_control_ratio)
	{
		if (vp->status & VOICE_LPE)
		{
			if (modes & PATCH_BIDIR)
				return rs_vib_bidir(song->resample_buffer, song->rate, vp, *countptr);
			else
				return rs_vib_loop(song->resample_buffer, song->rate, vp, *countptr);
		}
		else
		{
			return rs_vib_plain(song->resample_buffer, song->rate, vp, countptr);
		}
	}
	else
	{
		if (vp->status & VOICE_LPE)
		{
			if (modes & PATCH_BIDIR)
				return rs_bidir(song->resample_buffer, vp, *countptr);
			else
				return rs_loop(song->resample_buffer, vp, *countptr);
		}
		else
		{
			return rs_plain(song->resample_buffer, vp, countptr);
		}
	}
}